

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::argument_loader<sophiaevent_output_const*,int>::load_impl_sequence<0ul,1ul>
          (argument_loader<sophiaevent_output_const*,int> *this,long call)

{
  bool *pbVar1;
  bool bVar2;
  long lVar3;
  bool local_19;
  
  bVar2 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 8),(PyObject *)**(undefined8 **)(call + 8),
                     (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  local_19 = type_caster<int,_void>::load
                       ((type_caster<int,_void> *)this,*(PyObject **)(*(long *)(call + 8) + 8),
                        SUB41((**(uint **)(call + 0x20) & 2) >> 1,0));
  if (bVar2) {
    lVar3 = 0;
    do {
      bVar2 = lVar3 == 1;
      if (bVar2) {
        return bVar2;
      }
      pbVar1 = &local_19 + lVar3;
      lVar3 = lVar3 + 1;
    } while (*pbVar1 != false);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }